

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFrames.c
# Opt level: O1

Aig_Man_t *
Aig_ManFrames(Aig_Man_t *pAig,int nFs,int fInit,int fOuts,int fRegs,int fEnlarge,
             Aig_Obj_t ***ppObjMap)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t **__s;
  Aig_Man_t *p;
  char *__dest;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  Aig_Obj_t *p1;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  char *local_58;
  
  pVVar6 = pAig->vObjs;
  lVar8 = (long)nFs;
  sVar13 = pVVar6->nSize * lVar8 * 8;
  __s = (Aig_Obj_t **)malloc(sVar13);
  local_58 = (char *)0x0;
  memset(__s,0,sVar13);
  p = Aig_ManStart(pVVar6->nSize * nFs);
  pcVar2 = pAig->pName;
  if (pcVar2 != (char *)0x0) {
    sVar13 = strlen(pcVar2);
    local_58 = (char *)malloc(sVar13 + 1);
    strcpy(local_58,pcVar2);
  }
  p->pName = local_58;
  pcVar2 = pAig->pSpec;
  if (pcVar2 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar2);
    __dest = (char *)malloc(sVar13 + 1);
    strcpy(__dest,pcVar2);
  }
  p->pSpec = __dest;
  if (0 < nFs) {
    iVar11 = pAig->pConst1->Id;
    uVar7 = 0;
    do {
      __s[iVar11 * lVar8 + uVar7] = p->pConst1;
      uVar7 = uVar7 + 1;
    } while ((uint)nFs != uVar7);
  }
  if (0 < nFs) {
    iVar11 = 0;
    do {
      if (pAig->nRegs < pAig->nObjs[2]) {
        lVar10 = 0;
        do {
          if (pAig->vCis->nSize <= lVar10) goto LAB_005fcb6d;
          pvVar3 = pAig->vCis->pArray[lVar10];
          pAVar4 = Aig_ObjCreateCi(p);
          __s[*(int *)((long)pvVar3 + 0x24) * nFs + iVar11] = pAVar4;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)pAig->nObjs[2] - (long)pAig->nRegs);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFs);
  }
  uVar12 = pAig->nObjs[2] - pAig->nRegs;
  pVVar6 = pAig->vCis;
  iVar11 = pVVar6->nSize;
  if (fInit == 0) {
    if ((int)uVar12 < iVar11) {
      uVar7 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) goto LAB_005fcb6d;
        pvVar3 = pVVar6->pArray[uVar7];
        pAVar4 = Aig_ObjCreateCi(p);
        __s[*(int *)((long)pvVar3 + 0x24) * lVar8] = pAVar4;
        uVar7 = uVar7 + 1;
        pVVar6 = pAig->vCis;
      } while ((int)uVar7 < pVVar6->nSize);
    }
  }
  else if ((int)uVar12 < iVar11) {
    uVar7 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) goto LAB_005fcb6d;
      __s[*(int *)((long)pVVar6->pArray[uVar7] + 0x24) * lVar8] =
           (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < iVar11);
  }
  if (0 < nFs) {
    iVar11 = 0;
    do {
      pVVar6 = pAig->vObjs;
      if (0 < pVVar6->nSize) {
        lVar8 = 0;
        do {
          pvVar3 = pVVar6->pArray[lVar8];
          if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
            uVar7 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar4 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar4 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                       (ulong)__s[*(int *)(uVar7 + 0x24) * nFs + iVar11]);
            }
            uVar7 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                   (ulong)__s[*(int *)(uVar7 + 0x24) * nFs + iVar11]);
            }
            pAVar4 = Aig_And(p,pAVar4,p1);
            __s[*(int *)((long)pvVar3 + 0x24) * nFs + iVar11] = pAVar4;
          }
          lVar8 = lVar8 + 1;
          pVVar6 = pAig->vObjs;
        } while (lVar8 < pVVar6->nSize);
      }
      iVar9 = pAig->nRegs;
      lVar8 = (long)iVar9;
      if (0 < lVar8) {
        pVVar6 = pAig->vCos;
        iVar1 = pAig->nObjs[3];
        uVar7 = (ulong)(uint)(iVar1 - iVar9);
        iVar9 = -iVar9;
        do {
          if (((((int)uVar7 < 0) || (pVVar6->nSize <= iVar1 + iVar9)) ||
              (uVar12 = pAig->nObjs[2] + iVar9, (int)uVar12 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar12)) goto LAB_005fcb6d;
          uVar5 = *(ulong *)((long)pVVar6->pArray[uVar7] + 8);
          uVar14 = uVar5 & 0xfffffffffffffffe;
          if (uVar14 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar5 & 1) ^ (ulong)__s[*(int *)(uVar14 + 0x24) * nFs + iVar11])
            ;
          }
          if (iVar11 < nFs + -1) {
            __s[*(int *)((long)pAig->vCis->pArray[uVar12] + 0x24) * nFs + iVar11 + 1] = pAVar4;
          }
          uVar7 = uVar7 + 1;
          iVar9 = iVar9 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFs);
  }
  if (fOuts != 0) {
    iVar11 = nFs + -1;
    if (fEnlarge == 0) {
      iVar11 = 0;
    }
    if (iVar11 < nFs) {
      do {
        if (pAig->nRegs < pAig->nObjs[3]) {
          lVar8 = 0;
          do {
            if (pAig->vCos->nSize <= lVar8) goto LAB_005fcb6d;
            pvVar3 = pAig->vCos->pArray[lVar8];
            uVar7 = *(ulong *)((long)pvVar3 + 8);
            uVar5 = uVar7 & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              pAVar4 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar4 = (Aig_Obj_t *)
                       ((ulong)((uint)uVar7 & 1) ^ (ulong)__s[*(int *)(uVar5 + 0x24) * nFs + iVar11]
                       );
            }
            pAVar4 = Aig_ObjCreateCo(p,pAVar4);
            __s[*(int *)((long)pvVar3 + 0x24) * nFs + iVar11] = pAVar4;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (long)pAig->nObjs[3] - (long)pAig->nRegs);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != nFs);
    }
  }
  if (fRegs != 0) {
    p->nRegs = pAig->nRegs;
    uVar12 = pAig->nObjs[3] - pAig->nRegs;
    pVVar6 = pAig->vCos;
    if ((int)uVar12 < pVVar6->nSize) {
      iVar11 = 0;
      if (fEnlarge == 0) {
        iVar11 = nFs + -1;
      }
      uVar7 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) {
LAB_005fcb6d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pVVar6->pArray[uVar7];
        uVar5 = *(ulong *)((long)pvVar3 + 8);
        uVar14 = uVar5 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)uVar5 & 1) ^ (ulong)__s[*(int *)(uVar14 + 0x24) * nFs + iVar11]);
        }
        pAVar4 = Aig_ObjCreateCo(p,pAVar4);
        __s[*(int *)((long)pvVar3 + 0x24) * nFs + nFs + -1] = pAVar4;
        uVar7 = uVar7 + 1;
        pVVar6 = pAig->vCos;
      } while ((int)uVar7 < pVVar6->nSize);
    }
    Aig_ManSetRegNum(p,pAig->nRegs);
  }
  Aig_ManCleanup(p);
  if (ppObjMap == (Aig_Obj_t ***)0x0) {
    if (__s != (Aig_Obj_t **)0x0) {
      free(__s);
    }
  }
  else {
    *ppObjMap = __s;
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFs, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;

    // create mapping for the frames nodes
    pObjMap  = ABC_ALLOC( Aig_Obj_t *, nFs * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFs * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFs );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFs; f++ )
        Aig_ObjSetFrames( pObjMap, nFs, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFs; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    if ( fInit )
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ManConst0(pFrames) );
    }
    else 
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ObjCreateCi(pFrames) );
    }

    // add timeframes
    for ( f = 0; f < nFs; f++ )
    {
//        printf( "Frame = %d.\n", f );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
//            Aig_Obj_t * pFanin0 = Aig_ObjChild0Frames(pObjMap,nFs,pObj,f);
//            Aig_Obj_t * pFanin1 = Aig_ObjChild1Frames(pObjMap,nFs,pObj,f);
//            printf( "Node = %3d.  Fanin0 = %3d. Fanin1 = %3d.\n", pObj->Id, Aig_Regular(pFanin0)->Id, Aig_Regular(pFanin1)->Id );
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f), Aig_ObjChild1Frames(pObjMap,nFs,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFs,pObjLi,f);
            if ( f < nFs - 1 )
                Aig_ObjSetFrames( pObjMap, nFs, pObjLo, f+1, pObjNew );
        }
    }
    if ( fOuts )
    {
        for ( f = fEnlarge?nFs-1:0; f < nFs; f++ )
            Aig_ManForEachPoSeq( pAig, pObj, i )
            {
                pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f) );
                Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
            }
    }
    if ( fRegs )
    {
        pFrames->nRegs = pAig->nRegs;
        Aig_ManForEachLiSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,fEnlarge?0:nFs-1) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, nFs-1, pObjNew );
        }
        Aig_ManSetRegNum( pFrames, Aig_ManRegNum(pAig) );
    }
    Aig_ManCleanup( pFrames );
    // return the new manager
    if ( ppObjMap )
        *ppObjMap = pObjMap;
    else
        ABC_FREE( pObjMap );
    return pFrames;
}